

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

int Bac_PtrMemoryArrayArray(Vec_Ptr_t *vArrayArray)

{
  int iVar1;
  int *piVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < vArrayArray->nSize; i = i + 1) {
    piVar2 = (int *)Vec_PtrEntry(vArrayArray,i);
    if (piVar2 == (int *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (int)((double)*piVar2 * 8.0 + 16.0);
    }
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

int Bac_PtrMemoryArrayArray( Vec_Ptr_t * vArrayArray )
{
    Vec_Ptr_t * vArray; int i, nBytes = 0;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vArrayArray, vArray, i )
        nBytes += Bac_PtrMemoryArray(vArray);
    return nBytes;
}